

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O1

void __thiscall
AbstractTransaction_SetUnlockingScript_bytedata_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_bytedata_Test *this)

{
  ByteData *pBVar1;
  bool bVar2;
  char *message;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> bytedatas;
  AssertionResult gtest_ar;
  Transaction tx;
  Script local_170;
  undefined1 local_138 [32];
  internal local_118 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  char *local_108 [2];
  char local_f8 [16];
  AbstractTxInReference local_e8;
  Txid local_58 [2];
  
  cfd::core::Transaction::Transaction((Transaction *)local_58,2,3);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             "");
  cfd::core::Txid::Txid((Txid *)&local_170,(string *)local_108);
  local_138._0_8_ = (pointer)(local_138 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
  cfd::core::Script::Script((Script *)&local_e8,(string *)local_138);
  cfd::core::Transaction::AddTxIn(local_58,(uint)&local_170,0,(Script *)&DAT_ffffffff);
  cfd::core::Script::~Script((Script *)&local_e8);
  if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  local_170._vptr_Script = (_func_int **)&PTR__Txid_004deb78;
  if (local_170.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  local_138._0_8_ = (pointer)0x0;
  local_138._8_8_ = (pointer)0x0;
  local_138._16_8_ = (pointer)0x0;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Transaction::SetUnlockingScript((uint)local_58,(vector *)0x3);
  }
  testing::Message::Message((Message *)&local_e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xb0,
             "Expected: tx.SetUnlockingScript(3, bytedatas) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
  if (((local_e8._vptr_AbstractTxInReference != (_func_int **)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_e8._vptr_AbstractTxInReference != (_func_int **)0x0)) {
    (**(code **)(*local_e8._vptr_AbstractTxInReference + 8))();
  }
  pBVar1 = &local_e8.txid_.data_;
  local_e8._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763","");
  cfd::core::ByteData::ByteData((ByteData *)&local_170,(string *)&local_e8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
  emplace_back<cfd::core::ByteData>
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_138,
             (ByteData *)&local_170);
  if (local_170._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_170._vptr_Script);
  }
  if ((ByteData *)local_e8._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_e8._vptr_AbstractTxInReference);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Transaction::SetUnlockingScript((uint)local_58,(vector *)0x0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb6,
               "Expected: tx.SetUnlockingScript(0, bytedatas) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((ByteData *)local_e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
      local_e8._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  cfd::core::Transaction::GetTxIn((uint)&local_e8);
  cfd::core::Script::Script(&local_170,&local_e8.unlocking_script_);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_118,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",local_108[0]
             ,"2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  cfd::core::Script::~Script(&local_170);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_e8);
  if (local_118[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_110.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_110.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xb9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
    if ((ByteData *)local_e8._vptr_AbstractTxInReference != (ByteData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((ByteData *)local_e8._vptr_AbstractTxInReference != (ByteData *)0x0)) {
        (**(code **)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      local_e8._vptr_AbstractTxInReference)->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start + 8))();
      }
      local_e8._vptr_AbstractTxInReference = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_110,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_138);
  cfd::core::Transaction::~Transaction((Transaction *)local_58);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript_bytedata) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  std::vector<ByteData> bytedatas;
  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, bytedatas), CfdException);

  bytedatas.push_back(
      ByteData(
          "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"));

  EXPECT_NO_THROW(tx.SetUnlockingScript(0, bytedatas));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "2102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}